

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-group.c
# Opt level: O1

void monster_group_free(chunk_conflict *c,monster_group *group)

{
  mon_group_list_entry *pmVar1;
  mon_group_list_entry *p;
  
  p = group->member_list;
  while (p != (mon_group_list_entry *)0x0) {
    pmVar1 = p->next;
    mem_free(p);
    group->member_list = pmVar1;
    p = pmVar1;
  }
  mem_free(group);
  return;
}

Assistant:

void monster_group_free(struct chunk *c, struct monster_group *group)
{
	/* Free the member list */
	while (group->member_list) {
		struct mon_group_list_entry *next = group->member_list->next;
		mem_free(group->member_list);
		group->member_list = next;
	}

	mem_free(group);
}